

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetAll(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmNinjaBuild build;
  allocator<char> local_169;
  string local_168;
  string local_148;
  cmNinjaBuild local_128;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"phony",(allocator<char> *)&local_168);
  cmNinjaBuild::cmNinjaBuild(&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::assign((char *)&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_128.Outputs,&this->TargetAll);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_128.ExplicitDeps,&this->AllDependencies);
  WriteBuild(this,os,&local_128,0,(bool *)0x0);
  if ((this->OutputPathPrefix)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Make the all target the default.",&local_169);
    WriteDefault(os,&local_128.Outputs,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  cmNinjaBuild::~cmNinjaBuild(&local_128);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetAll(std::ostream& os)
{
  cmNinjaBuild build("phony");
  build.Comment = "The main all target.";
  build.Outputs.push_back(this->TargetAll);
  build.ExplicitDeps = this->AllDependencies;
  this->WriteBuild(os, build);

  if (!this->HasOutputPathPrefix()) {
    cmGlobalNinjaGenerator::WriteDefault(os, build.Outputs,
                                         "Make the all target the default.");
  }
}